

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

int monteCarloBiomes(Generator *g,Range r,uint64_t *rng,double coverage,double confidence,
                    _func_int_Generator_ptr_int_int_int_int_void_ptr *eval,void *data)

{
  undefined8 *puVar1;
  void *__ptr;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  int *piVar15;
  uint64_t uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double local_d0;
  
  uVar18 = r.sy + (uint)(r.sy == 0);
  uVar8 = (long)r.sx * (long)r.sz * (long)(int)uVar18;
  dVar20 = inverf(confidence);
  dVar20 = dVar20 * 1.4142135623730951;
  auVar23._8_4_ = (int)(uVar8 >> 0x20);
  auVar23._0_8_ = uVar8;
  auVar23._12_4_ = 0x45300000;
  dVar25 = (auVar23._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
  dVar26 = SQRT(dVar25) * dVar20;
  dVar24 = (dVar20 * dVar20) / dVar26;
  dVar21 = ((1.0 - coverage) * coverage + dVar24 * 0.25) / dVar26;
  if (dVar21 < 0.0) {
    dVar21 = sqrt(dVar21);
  }
  else {
    dVar21 = SQRT(dVar21);
  }
  __ptr = (void *)0x0;
  uVar19 = 1;
  if ((uVar8 < 0x7fffffff) && (dVar25 < dVar26 * 4.0)) {
    __ptr = malloc(uVar8 * 0xc);
    if (__ptr == (void *)0x0) {
      __ptr = (void *)0x0;
    }
    else {
      uVar19 = 0;
      if (0 < (int)uVar18) {
        lVar7 = 0;
        do {
          if (0 < r.sz) {
            iVar9 = 0;
            do {
              if (0 < r.sx) {
                piVar15 = (int *)((long)__ptr + lVar7 * 0xc + 8);
                lVar13 = 0;
                do {
                  piVar15[-2] = (int)lVar13;
                  piVar15[-1] = uVar19;
                  *piVar15 = iVar9;
                  piVar15 = piVar15 + 3;
                  lVar13 = lVar13 + 1;
                } while (r.sx != (int)lVar13);
                lVar7 = lVar7 + lVar13;
              }
              iVar9 = iVar9 + 1;
            } while (iVar9 != r.sz);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar18);
        uVar19 = 0;
      }
    }
  }
  if (uVar8 != 0) {
    dVar25 = 1.0 / (dVar24 + 1.0);
    dVar24 = (dVar24 * 0.5 + coverage) * dVar25;
    dVar21 = dVar20 * dVar25 * dVar21 + 1.1920928955078125e-07;
    uVar10 = r.sx - ((uint)r.sx >> 1 & 0x55555555);
    uVar11 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
    uVar10 = uVar18 - (uVar18 >> 1 & 0x55555555);
    uVar14 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
    uVar10 = r.sz - ((uint)r.sz >> 1 & 0x55555555);
    uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
    uVar2 = 0;
    dVar25 = 0.0;
    local_d0 = 0.0;
    do {
      if ((char)uVar19 == '\0') {
        uVar3 = (int)uVar8 - (int)uVar2;
        uVar12 = uVar3 - 1;
        if ((uVar3 & uVar12) == 0) {
          uVar17 = *rng * 0x5deece66d + 0xb & 0xffffffffffff;
          *rng = uVar17;
          uVar6 = (uint)((uVar17 >> 0x11) * (long)(int)uVar3 >> 0x1f);
        }
        else {
          uVar16 = *rng;
          do {
            uVar16 = uVar16 * 0x5deece66d + 0xb & 0xffffffffffff;
            uVar6 = (uint)((long)(uVar16 >> 0x11) % (long)(int)uVar3);
          } while (-1 < (int)(uVar6 - ((int)(uVar16 >> 0x11) + uVar3)));
          *rng = uVar16;
        }
        lVar7 = (long)(int)uVar6;
        iVar9 = *(int *)((long)__ptr + lVar7 * 0xc);
        iVar4 = *(int *)((long)__ptr + lVar7 * 0xc + 4);
        iVar5 = *(int *)((long)__ptr + lVar7 * 0xc + 8);
        if (uVar6 != uVar12) {
          puVar1 = (undefined8 *)((long)__ptr + lVar7 * 0xc);
          lVar7 = (long)(int)uVar12;
          *(undefined4 *)(puVar1 + 1) = *(undefined4 *)((long)__ptr + lVar7 * 0xc + 8);
          *puVar1 = *(undefined8 *)((long)__ptr + lVar7 * 0xc);
          *(int *)((long)__ptr + lVar7 * 0xc) = iVar9;
          *(int *)((long)__ptr + lVar7 * 0xc + 4) = iVar4;
          *(int *)((long)__ptr + lVar7 * 0xc + 8) = iVar5;
        }
      }
      else {
        uVar16 = *rng;
        if (((uVar11 >> 4) + uVar11 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2) {
          uVar16 = uVar16 * 0x5deece66d + 0xb & 0xffffffffffff;
          iVar9 = (int)((uVar16 >> 0x11) * (long)r.sx >> 0x1f);
        }
        else {
          do {
            uVar16 = uVar16 * 0x5deece66d + 0xb & 0xffffffffffff;
            iVar9 = (int)((long)(uVar16 >> 0x11) % (long)r.sx);
          } while (-1 < iVar9 - ((int)(uVar16 >> 0x11) + r.sx));
        }
        if (((uVar14 >> 4) + uVar14 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2) {
          uVar16 = uVar16 * 0x5deece66d + 0xb & 0xffffffffffff;
          iVar4 = (int)((uVar16 >> 0x11) * (long)(int)uVar18 >> 0x1f);
        }
        else {
          do {
            uVar16 = uVar16 * 0x5deece66d + 0xb & 0xffffffffffff;
            iVar4 = (int)((long)(uVar16 >> 0x11) % (long)(int)uVar18);
          } while (-1 < (int)(iVar4 - ((int)(uVar16 >> 0x11) + uVar18)));
        }
        if (((uVar10 >> 4) + uVar10 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2) {
          uVar17 = uVar16 * 0x5deece66d + 0xb & 0xffffffffffff;
          *rng = uVar17;
          iVar5 = (int)((uVar17 >> 0x11) * (long)r.sz >> 0x1f);
        }
        else {
          do {
            uVar16 = uVar16 * 0x5deece66d + 0xb & 0xffffffffffff;
            iVar5 = (int)((long)(uVar16 >> 0x11) % (long)r.sz);
          } while (-1 < iVar5 - ((int)(uVar16 >> 0x11) + r.sz));
          *rng = uVar16;
        }
      }
      iVar9 = (*eval)(g,r.scale,iVar9 + r.x,iVar4 + r.y,iVar5 + r.z,data);
      if (iVar9 != -1) {
        uVar3 = 0;
        if (iVar9 != 0) {
          if (iVar9 != 1) goto LAB_001112b3;
          dVar25 = dVar25 + 1.0;
        }
        local_d0 = local_d0 + 1.0;
        dVar28 = 1.0 / local_d0;
        dVar27 = dVar28 * dVar25;
        dVar30 = (dVar20 * dVar20) / local_d0;
        dVar26 = ((1.0 - dVar27) * dVar27 + dVar30 * 0.25) / local_d0;
        if (dVar26 < 0.0) {
          dVar26 = sqrt(dVar26);
        }
        else {
          dVar26 = SQRT(dVar26);
        }
        uVar3 = 0;
        dVar22 = 1.0 / (dVar30 + 1.0);
        dVar29 = (dVar30 * 0.5 + dVar27) * dVar22;
        dVar30 = dVar22 * dVar20 * dVar26 + 1.1920928955078125e-07;
        dVar26 = dVar29 - dVar30;
        if (coverage < dVar26 - dVar28) break;
        dVar30 = dVar30 + dVar29;
        if (dVar28 + dVar30 < coverage) goto LAB_001112b3;
        if (dVar30 - dVar26 < (dVar21 + dVar24) - (dVar24 - dVar21)) {
          uVar3 = (uint)(coverage < dVar27);
          goto LAB_001112b3;
        }
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != uVar8);
  }
  uVar3 = 1;
LAB_001112b3:
  if ((char)uVar19 == '\0') {
    free(__ptr);
  }
  return uVar3;
}

Assistant:

int monteCarloBiomes(
        Generator         * g,
        Range               r,
        uint64_t          * rng,
        double              coverage,
        double              confidence,
        int (*eval)(Generator *g, int scale, int x, int y, int z, void*),
        void              * data
        )
{
    if (r.sy == 0)
        r.sy = 1;

    struct touple { int x, y, z; } *buf = 0;
    size_t n = (size_t)r.sx*r.sy*r.sz;

    // z-score (i.e. probit, or standard deviations) for the confidence
    double zscore = sqrt(2.0) * inverf(confidence);

    // One standard deviation is approximately given by sqrt(n) elements,
    // hence we will take zscore * sqrt(n) as the maximum number of samples
    // to reach the desired confidence. This gives us a wilson score interval
    // for the upper and lower bound of successes we aim for.
    double wn = zscore * sqrt(n);
    double wlo, whi;
    wilson(wn, coverage, zscore, &wlo, &whi);

    // When the number of samples approaches the total number elements,
    // we can avoid repeated samples by shuffling a buffer.
    // (TODO: adjust for hypergeometric distribution?)
    if (n < 4 * wn && n < INT_MAX)
        buf = (struct touple*) malloc(n * sizeof(*buf));

    if (buf)
    {
        size_t idx = 0;
        int i, k, j;
        for (k = 0; k < r.sy; k++)
        {
            for (j = 0; j < r.sz; j++)
            {
                for (i = 0; i < r.sx; i++)
                {
                    buf[idx].x = i;
                    buf[idx].y = k;
                    buf[idx].z = j;
                    idx++;
                }
            }
        }
    }

    size_t i = 0;
    double m = 0; // number of samples
    double x = 0; // number of successes
    int ret = 1;

    // iterate over the area in a random order
    for (i = 0; i < n; i++)
    {
        struct touple t;
        if (buf)
        {
            int j = n - i;
            int k = nextInt(rng, j);
            t = buf[k];
            if (k != j-1)
            {
                buf[k] = buf[j-1];
                buf[j-1] = t;
            }
        }
        else
        {
            t.x = nextInt(rng, r.sx);
            t.y = nextInt(rng, r.sy);
            t.z = nextInt(rng, r.sz);
        }

        int status = eval(g, r.scale, r.x+t.x, r.y+t.y, r.z+t.z, data);
        if (status == -1)
            continue;
        else if (status == 0)
            ;
        else if (status == 1)
            x += 1.0;
        else
        {
            ret = 0;
            break;
        }
        m += 1.0;

        // check if we can abort early with the current confidence interval
        double per_m = 1.0 / m;
        double lo, hi;
        wilson(m, x * per_m, zscore, &lo, &hi);

        if (lo - per_m > coverage)
        {
            ret = 1;
            break;
        }
        if (hi + per_m < coverage)
        {
            ret = 0;
            break;
        }

        if (hi - lo < whi - wlo)
        {   // should occur around i ~ wn
            ret = x * per_m > coverage;
            break;
        }
    }
    if (buf)
        free(buf);
    return ret;
}